

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_t.cpp
# Opt level: O0

void __thiscall deci::ast_postfix_t::~ast_postfix_t(ast_postfix_t *this)

{
  ast_arg_list_t *this_00;
  ast_postfix_t *this_local;
  
  this_00 = this->arglist;
  if (this_00 != (ast_arg_list_t *)0x0) {
    ast_arg_list_t::~ast_arg_list_t(this_00);
    operator_delete(this_00);
  }
  std::__cxx11::string::~string((string *)&this->identifier);
  ast_item_t::~ast_item_t(&this->super_ast_item_t);
  return;
}

Assistant:

ast_postfix_t::~ast_postfix_t() {
    delete this->arglist;
  }